

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  undefined1 *puVar1;
  byte bVar2;
  int iVar3;
  curl_trc_feat *pcVar4;
  sockaddr *psVar5;
  ushort type;
  bool bVar6;
  undefined8 uVar7;
  bool bVar8;
  DOHcode DVar9;
  CURLcode CVar10;
  uchar *doh;
  size_t dohlen;
  ulong uVar11;
  size_t sVar12;
  Curl_addrinfo *pCVar13;
  Curl_dns_entry *entry;
  ushort uVar14;
  sa_family_t sVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  anon_union_16_2_f9ece763_for_ip *paVar19;
  int iVar20;
  doh_probes *pdVar21;
  doh_probes *pdVar22;
  Curl_addrinfo *addr;
  DNStype DVar23;
  DNStype DVar24;
  DOHcode *pDVar25;
  Curl_addrinfo *pCVar26;
  uint uVar27;
  size_t sVar28;
  long lVar29;
  dohentry *pdVar30;
  dohentry de;
  uint local_2e4;
  Curl_addrinfo *local_2e0;
  DOHcode local_2d8;
  DOHcode local_2d4;
  doh_probes *local_2d0;
  long local_2c8;
  Curl_easy *local_2c0;
  Curl_dns_entry **local_2b8;
  size_t local_2b0;
  char *local_2a8;
  dohentry local_2a0;
  
  pdVar21 = (data->state).async.doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar21 == (doh_probes *)0x0) {
    CVar10 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar21->probe_resp[0].probe_mid == 0xffffffff) &&
          (pdVar21->probe_resp[1].probe_mid == 0xffffffff)) {
    Curl_failf(data,"Could not DoH-resolve: %s",pdVar21->host);
    CVar10 = (((ulong)data->conn->bits & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar10 = CURLE_OK;
    if (pdVar21->pending == 0) {
      local_2b8 = dnsp;
      Curl_resolv_unlink(data,&(data->state).async.dns);
      lVar18 = 0;
      local_2d8 = DOH_OK;
      local_2d4 = DOH_OK;
      Curl_doh_close(data);
      memset(&local_2a0,0,0x270);
      local_2a0.ttl = 0x7fffffff;
      do {
        Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar18),0x100);
        lVar18 = lVar18 + 0x20;
      } while (lVar18 != 0x80);
      pDVar25 = &local_2d8;
      lVar18 = 0;
      bVar6 = true;
      local_2d0 = pdVar21;
      local_2c0 = data;
LAB_00125077:
      pdVar22 = pdVar21;
      if (pdVar21->probe_resp[lVar18].dnstype != 0) {
        s = &pdVar21->probe_resp[lVar18].body;
        doh = Curl_dyn_uptr(s);
        dohlen = Curl_dyn_len(s);
        DVar9 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < dohlen) && (DVar9 = DOH_DNS_BAD_ID, doh != (uchar *)0x0)) && (*doh == '\0')) &&
           ((doh[1] == '\0' && (DVar9 = DOH_DNS_BAD_RCODE, (doh[3] & 0xf) == 0)))) {
          sVar28 = 0xc;
          for (uVar14 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8; uVar14 != 0;
              uVar14 = uVar14 - 1) {
            do {
              uVar27 = (int)sVar28 + 1;
              if (dohlen < uVar27) goto LAB_00125408;
              bVar2 = doh[sVar28];
              if ((bVar2 & 0xc0) != 0) {
                DVar9 = DOH_DNS_BAD_LABEL;
                if ((bVar2 & 0xc0) != 0xc0) goto LAB_0012540d;
                uVar27 = (int)sVar28 + 2;
                if (dohlen < uVar27) goto LAB_00125408;
                break;
              }
              uVar27 = uVar27 + bVar2;
              sVar28 = (size_t)uVar27;
              if (dohlen < sVar28) goto LAB_00125408;
            } while (bVar2 != 0);
            sVar28 = (size_t)(uVar27 + 4);
            DVar9 = DOH_DNS_OUT_OF_RANGE;
            if (dohlen < sVar28) goto LAB_0012540d;
          }
          uVar14 = *(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8;
          DVar23 = pdVar21->probe_resp[lVar18].dnstype;
          if (uVar14 == 0) {
            local_2e0 = (Curl_addrinfo *)CONCAT71(local_2e0._1_7_,1);
          }
          else {
LAB_00125183:
            do {
              uVar27 = (int)sVar28 + 1;
              if (dohlen < uVar27) goto LAB_00125408;
              bVar2 = doh[sVar28];
              if ((bVar2 & 0xc0) == 0) {
                uVar27 = uVar27 + bVar2;
                uVar11 = (ulong)uVar27;
                if (dohlen < uVar11) goto LAB_00125408;
                sVar28 = (size_t)uVar27;
                if (bVar2 != 0) goto LAB_00125183;
              }
              else {
                DVar9 = DOH_DNS_BAD_LABEL;
                if ((bVar2 & 0xc0) != 0xc0) goto LAB_0012540d;
                uVar11 = (ulong)((int)sVar28 + 2);
                if (dohlen < uVar11) goto LAB_00125408;
              }
              iVar20 = (int)uVar11;
              if (dohlen < iVar20 + 2) goto LAB_00125408;
              type = CONCAT11(doh[uVar11],doh[iVar20 + 1]);
              DVar24 = (DNStype)type;
              if (((DVar24 != DNS_TYPE_CNAME) && (DVar24 != DNS_TYPE_DNAME)) && (DVar23 != DVar24))
              {
                DVar9 = DOH_DNS_UNEXPECTED_TYPE;
                goto LAB_0012540d;
              }
              if (dohlen < iVar20 + 4) goto LAB_00125408;
              if (CONCAT11(doh[iVar20 + 2],doh[iVar20 + 3]) != 1) {
                DVar9 = DOH_DNS_UNEXPECTED_CLASS;
                goto LAB_0012540d;
              }
              if (dohlen < iVar20 + 8) goto LAB_00125408;
              uVar27 = *(uint *)(doh + (iVar20 + 4));
              uVar27 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                       uVar27 << 0x18;
              if (uVar27 < local_2a0.ttl) {
                local_2a0.ttl = uVar27;
              }
              uVar27 = iVar20 + 10;
              if (dohlen < uVar27) goto LAB_00125408;
              sVar28 = (size_t)(uVar27 + CONCAT11(doh[iVar20 + 8],doh[iVar20 + 9]));
              DVar9 = DOH_DNS_OUT_OF_RANGE;
              if (dohlen < sVar28) goto LAB_0012540d;
              local_2c8 = CONCAT62(local_2c8._2_6_,uVar14);
              local_2e0 = (Curl_addrinfo *)CONCAT44(local_2e0._4_4_,DVar23);
              DVar9 = doh_rdata(doh,dohlen,CONCAT11(doh[iVar20 + 8],doh[iVar20 + 9]),type,uVar27,
                                &local_2a0);
              if (DVar9 != DOH_OK) goto LAB_0012540d;
              uVar14 = (short)local_2c8 - 1;
              DVar23 = (DNStype)local_2e0;
            } while (uVar14 != 0);
            local_2e0 = (Curl_addrinfo *)CONCAT71(local_2e0._1_7_,type != 2);
          }
          local_2e4 = (uint)sVar28;
          uVar27 = local_2e4;
          for (uVar14 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8; uVar14 != 0;
              uVar14 = uVar14 - 1) {
            do {
              uVar27 = (int)sVar28 + 1;
              if (dohlen < uVar27) goto LAB_00125408;
              bVar2 = doh[sVar28];
              if ((bVar2 & 0xc0) != 0) {
                DVar9 = DOH_DNS_BAD_LABEL;
                if ((bVar2 & 0xc0) != 0xc0) goto LAB_0012540d;
                uVar27 = (int)sVar28 + 2;
                if (dohlen < uVar27) goto LAB_00125408;
                break;
              }
              uVar27 = uVar27 + bVar2;
              if (dohlen < uVar27) goto LAB_00125408;
              sVar28 = (size_t)uVar27;
            } while (bVar2 != 0);
            if ((dohlen < uVar27 + 8) || (dohlen < uVar27 + 10)) goto LAB_00125408;
            uVar27 = (uint)CONCAT11(doh[uVar27 + 8],doh[uVar27 + 9]) + uVar27 + 10;
            sVar28 = (size_t)uVar27;
            DVar9 = DOH_DNS_OUT_OF_RANGE;
            if (dohlen < sVar28) goto LAB_0012540d;
          }
          pdVar22 = local_2d0;
          data = local_2c0;
          local_2e4 = uVar27;
          for (uVar14 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8; local_2d0 = pdVar22
              , local_2c0 = data, uVar14 != 0; uVar14 = uVar14 - 1) {
            DVar9 = doh_skipqname(doh,dohlen,&local_2e4);
            if (DVar9 != DOH_OK) goto LAB_0012540d;
            DVar9 = DOH_DNS_OUT_OF_RANGE;
            if ((dohlen < local_2e4 + 8) || (dohlen < local_2e4 + 10)) goto LAB_0012540d;
            uVar27 = (uint)CONCAT11(doh[local_2e4 + 8],doh[local_2e4 + 9]) + local_2e4 + 10;
            sVar28 = (size_t)uVar27;
            if (dohlen < sVar28) goto LAB_0012540d;
            pdVar22 = local_2d0;
            data = local_2c0;
            local_2e4 = uVar27;
          }
          DVar9 = DOH_DNS_MALFORMAT;
          if ((dohlen == sVar28) &&
             ((((byte)local_2e0 & local_2a0.numcname == 0) != 1 ||
              (DVar9 = DOH_NO_CONTENT, local_2a0.numaddr != 0)))) {
            *pDVar25 = DOH_OK;
            goto LAB_00125493;
          }
        }
        goto LAB_0012540d;
      }
      goto LAB_00125493;
    }
  }
  return CVar10;
LAB_00125408:
  DVar9 = DOH_DNS_OUT_OF_RANGE;
LAB_0012540d:
  data = local_2c0;
  pdVar22 = local_2d0;
  *pDVar25 = DVar9;
  if (((local_2c0 != (Curl_easy *)0x0) && (((local_2c0->set).field_0x89f & 0x40) != 0)) &&
     ((pcVar4 = (local_2c0->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
     ) {
    pcVar17 = "bad error code";
    if (DVar9 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) {
      pcVar17 = errors_rel + *(int *)(errors_rel + (ulong)DVar9 * 4);
    }
    DVar23 = pdVar21->probe_resp[lVar18].dnstype;
    pcVar16 = "unknown";
    if (DVar23 == DNS_TYPE_AAAA) {
      pcVar16 = "AAAA";
    }
    if (DVar23 == DNS_TYPE_A) {
      pcVar16 = "A";
    }
    Curl_infof(local_2c0,"DoH: %s type %s for %s",pcVar17,pcVar16,local_2d0->host);
  }
LAB_00125493:
  lVar18 = 1;
  pDVar25 = &local_2d4;
  bVar8 = !bVar6;
  pdVar21 = pdVar22;
  bVar6 = false;
  if (bVar8) goto LAB_0012551c;
  goto LAB_00125077;
LAB_0012551c:
  if ((local_2d8 == DOH_OK) || (CVar10 = CURLE_COULDNT_RESOLVE_HOST, local_2d4 == DOH_OK)) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
        (0 < Curl_trc_feat_dns.log_level)))) {
      Curl_trc_dns(data,"hostname: %s",pdVar22->host);
      doh_show(data,&local_2a0);
    }
    pcVar17 = pdVar22->host;
    iVar20 = pdVar22->port;
    sVar12 = strlen(pcVar17);
    if (local_2a0.numaddr == 0) {
      CVar10 = CURLE_COULDNT_RESOLVE_HOST;
LAB_0012578a:
      pdVar30 = &local_2a0;
      if (local_2a0.numcname < 1) {
        return CVar10;
      }
      lVar18 = 0;
      do {
        Curl_dyn_free(pdVar30->cname);
        lVar18 = lVar18 + 1;
        pdVar30 = (dohentry *)(pdVar30->cname + 1);
      } while (lVar18 < local_2a0.numcname);
      return CVar10;
    }
    if (local_2a0.numaddr < 1) {
      addr = (Curl_addrinfo *)0x0;
    }
    else {
      local_2b0 = sVar12 + 1;
      local_2c8 = sVar12 + 0x31;
      paVar19 = &local_2a0.addr[0].ip;
      lVar18 = 0;
      addr = (Curl_addrinfo *)0x0;
      pCVar26 = (Curl_addrinfo *)0x0;
      local_2a8 = pcVar17;
      do {
        iVar3 = ((dohaddr *)((long)paVar19 + -4))->type;
        lVar29 = 0x1c;
        if (iVar3 != 0x1c) {
          lVar29 = 0x10;
        }
        local_2e0 = addr;
        pCVar13 = (Curl_addrinfo *)(*Curl_ccalloc)(1,local_2c8 + lVar29);
        if (pCVar13 == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(local_2e0);
          CVar10 = CURLE_OUT_OF_MEMORY;
          goto LAB_0012578a;
        }
        pCVar13->ai_addr = (sockaddr *)(pCVar13 + 1);
        pcVar17 = (char *)((long)&pCVar13[1].ai_flags + lVar29);
        pCVar13->ai_canonname = pcVar17;
        memcpy(pcVar17,local_2a8,local_2b0);
        addr = local_2e0;
        if (local_2e0 == (Curl_addrinfo *)0x0) {
          addr = pCVar13;
        }
        if (pCVar26 != (Curl_addrinfo *)0x0) {
          pCVar26->ai_next = pCVar13;
        }
        pCVar13->ai_family = (uint)(iVar3 == 0x1c) * 8 + 2;
        pCVar13->ai_socktype = 1;
        pCVar13->ai_addrlen = (curl_socklen_t)lVar29;
        psVar5 = pCVar13->ai_addr;
        if (iVar3 == 0x1c) {
          uVar7 = *(undefined8 *)((long)paVar19 + 8);
          *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)paVar19;
          psVar5[1].sa_family = (short)uVar7;
          psVar5[1].sa_data[0] = (char)((ulong)uVar7 >> 0x10);
          psVar5[1].sa_data[1] = (char)((ulong)uVar7 >> 0x18);
          psVar5[1].sa_data[2] = (char)((ulong)uVar7 >> 0x20);
          psVar5[1].sa_data[3] = (char)((ulong)uVar7 >> 0x28);
          psVar5[1].sa_data[4] = (char)((ulong)uVar7 >> 0x30);
          psVar5[1].sa_data[5] = (char)((ulong)uVar7 >> 0x38);
          sVar15 = 10;
        }
        else {
          *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)paVar19;
          sVar15 = 2;
        }
        psVar5->sa_family = sVar15;
        *(ushort *)psVar5->sa_data = (ushort)iVar20 << 8 | (ushort)iVar20 >> 8;
        lVar18 = lVar18 + 1;
        paVar19 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar19 + 0x14);
        pCVar26 = pCVar13;
      } while (lVar18 < local_2a0.numaddr);
      pcVar17 = local_2d0->host;
      iVar20 = local_2d0->port;
      data = local_2c0;
    }
    CVar10 = CURLE_OK;
    entry = Curl_dnscache_mk_entry(data,addr,pcVar17,0,iVar20,false);
    if (entry != (Curl_dns_entry *)0x0) {
      (data->state).async.dns = entry;
      CVar10 = Curl_dnscache_add(data,entry);
      *local_2b8 = (data->state).async.dns;
    }
  }
  puVar1 = &(data->state).async.field_0x28;
  *puVar1 = *puVar1 | 1;
  if (0 < local_2a0.numcname) {
    pdVar30 = &local_2a0;
    lVar18 = 0;
    do {
      Curl_dyn_free(pdVar30->cname);
      lVar18 = lVar18 + 1;
      pdVar30 = (dohentry *)(pdVar30->cname + 1);
    } while (lVar18 < local_2a0.numcname);
  }
  Curl_doh_cleanup(data);
  return CVar10;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->state.async.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe_resp[DOH_SLOT_IPV4].probe_mid == UINT_MAX &&
     dohp->probe_resp[DOH_SLOT_IPV6].probe_mid == UINT_MAX) {
    failf(data, "Could not DoH-resolve: %s", dohp->host);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    /* Clear any result the might still be there */
    Curl_resolv_unlink(data, &data->state.async.dns);

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_response *p = &dohp->probe_resp[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->body),
                                 Curl_dyn_len(&p->body),
                                 p->dnstype, &de);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_trc_feat_dns)) {
        CURL_TRC_DNS(data, "hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      /* we got a response, create a dns entry. */
      dns = Curl_dnscache_mk_entry(data, ai, dohp->host, 0, dohp->port, FALSE);
      if(dns) {
        /* Now add and HTTPSRR information if we have */
#ifdef USE_HTTPSRR
        if(de.numhttps_rrs > 0 && result == CURLE_OK) {
          struct Curl_https_rrinfo *hrr = NULL;
          result = doh_resp_decode_httpsrr(data, de.https_rrs->val,
                                           de.https_rrs->len, &hrr);
          if(result) {
            infof(data, "Failed to decode HTTPS RR");
            return result;
          }
          infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
          doh_print_httpsrr(data, hrr);
# endif
          dns->hinfo = hrr;
       }
#endif
        /* and add the entry to the cache */
        data->state.async.dns = dns;
        result = Curl_dnscache_add(data, dns);
        *dnsp = data->state.async.dns;
      }
    } /* address processing done */

    /* All done */
    data->state.async.done = TRUE;
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}